

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::CheckTableType(VM *this,Value *t,Value *k,char *op,char *desc)

{
  CFunctionType p_Var1;
  RuntimeException *this_00;
  char *__rhs;
  pair<const_char_*,_const_char_*> pVar2;
  pair<const_char_*,_int> pVar3;
  allocator local_e1;
  char *local_e0;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op_desc;
  
  if ((t->type_ != ValueT_Table) &&
     ((t->type_ != ValueT_UserData ||
      ((((t->field_0).closure_)->upvalues_).
       super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0)))) {
    pVar2 = GetOperandNameAndScope(this,t);
    local_e0 = pVar2.second;
    local_d8 = pVar2.first;
    pVar3 = GetCurrentInstructionPos(this);
    if (k->type_ == ValueT_String) {
      p_Var1 = (k->field_0).cfunc_;
      if (p_Var1[0x11] == (_func_int_State_ptr)0x0) {
        __rhs = (char *)(p_Var1 + 0x18);
      }
      else {
        __rhs = *(char **)(p_Var1 + 0x18);
      }
    }
    else {
      __rhs = "?";
    }
    std::__cxx11::string::string((string *)&local_d0,op,&local_e1);
    std::operator+(&local_b0,&local_d0," table key \'");
    std::operator+(&local_90,&local_b0,__rhs);
    std::operator+(&local_70,&local_90,"\' ");
    std::operator+(&op_desc,&local_70,desc);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException
              (this_00,pVar3.first,pVar3.second,t,local_d8,local_e0,op_desc._M_dataplus._M_p);
    __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void VM::CheckTableType(const Value *t, const Value *k,
                            const char *op, const char *desc) const
    {
        if (t->type_ == ValueT_Table ||
            (t->type_ == ValueT_UserData && t->user_data_->GetMetatable()))
            return ;

        auto ns = GetOperandNameAndScope(t);
        auto pos = GetCurrentInstructionPos();
        auto key_name = k->type_ == ValueT_String ? k->str_->GetCStr() : "?";
        auto op_desc = std::string(op) + " table key '" + key_name + "' " + desc;

        throw RuntimeException(pos.first, pos.second, t,
                ns.first, ns.second, op_desc.c_str());
    }